

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

void av1_remove_common(AV1_COMMON *cm)

{
  long in_RDI;
  
  av1_free_context_buffers((AV1_COMMON *)0x6b18fe);
  aom_free(cm);
  *(undefined8 *)(in_RDI + 0x6090) = 0;
  aom_free(cm);
  *(undefined8 *)(in_RDI + 0x6098) = 0;
  return;
}

Assistant:

void av1_remove_common(AV1_COMMON *cm) {
  av1_free_context_buffers(cm);

  aom_free(cm->fc);
  cm->fc = NULL;
  aom_free(cm->default_frame_context);
  cm->default_frame_context = NULL;
}